

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t *psVar4;
  pointer pMVar5;
  int *piVar6;
  byte bVar7;
  Mat *pMVar8;
  undefined4 *puVar9;
  int iVar10;
  void *pvVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  int iVar17;
  undefined4 *puVar18;
  int iVar19;
  int iVar20;
  void *pvVar21;
  int iVar22;
  undefined4 *puVar23;
  void *pvVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  bool bVar30;
  int local_a0;
  Mat local_88;
  Mat *local_40;
  Mat *local_38;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar5->dims;
  iVar10 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar1 == 1) {
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar14 == 0) {
      uVar12 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar6 = &pMVar5->w;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + piVar6[-5] * *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    bVar7 = (uVar12 & 3) == 0 & opt->use_packing_layout;
    iVar22 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,(int)uVar12 / iVar22,
                pMVar5->elemsize / (ulong)(long)pMVar5->elempack << bVar7 * '\x02',iVar22,
                opt->blob_allocator);
    pvVar11 = pMVar8->data;
    if (pvVar11 == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar8->c * pMVar8->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      lVar14 = 0x2c;
      uVar25 = 0;
      do {
        memcpy(pvVar11,*(void **)((long)pMVar5 + lVar14 + -0x2c),
               (long)*(int *)((long)&pMVar5->data + lVar14) *
               *(long *)((long)pMVar5 + lVar14 + -0x1c));
        pvVar11 = (void *)((long)pvVar11 +
                          (long)*(int *)((long)pMVar5 + lVar14 + -0x14) *
                          (long)*(int *)((long)&pMVar5->data + lVar14) * 4);
        uVar25 = uVar25 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x48;
      } while (uVar25 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (bVar30) {
      return -100;
    }
  }
  iVar10 = (iVar10 >> 0x1f & uVar1) + iVar10;
  if ((uVar1 == 2) && (iVar10 == 0)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar22 = pMVar5->w;
    uVar25 = pMVar5->elemsize;
    iVar13 = pMVar5->elempack;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar14 == 0) {
      uVar12 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar6 = &pMVar5->h;
      uVar12 = 0;
      do {
        if (*(ulong *)(piVar6 + -8) < uVar25) {
          uVar25 = *(ulong *)(piVar6 + -8);
        }
        iVar17 = piVar6[-6];
        if (iVar17 < iVar13) {
          iVar13 = iVar17;
        }
        uVar12 = uVar12 + iVar17 * *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    bVar7 = (uVar12 & 3) == 0 & opt->use_packing_layout;
    iVar17 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,iVar22,(int)uVar12 / iVar17,uVar25 / (ulong)(long)iVar13 << bVar7 * '\x02',
                iVar17,opt->blob_allocator);
    if (pMVar8->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar8->c * pMVar8->cstep == 0) {
      return -100;
    }
    local_88.data = pMVar8->data;
    piVar6 = pMVar8->refcount;
    local_88.refcount._0_4_ = SUB84(piVar6,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)pMVar8->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(pMVar8->elemsize >> 0x20);
    local_88.elempack = pMVar8->elempack;
    local_88.allocator = pMVar8->allocator;
    local_88.dims = pMVar8->dims;
    local_88.w = pMVar8->w;
    local_88.h = pMVar8->h;
    local_88.d = pMVar8->d;
    local_88.c = pMVar8->c;
    local_88.cstep = pMVar8->cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_38 = pMVar8;
    if ((iVar13 < iVar17) &&
       ((Mat::create(&local_88,iVar22,(int)uVar12 / iVar13,uVar25,iVar13,opt->workspace_allocator),
        (undefined4 *)local_88.data == (undefined4 *)0x0 || ((long)local_88.c * local_88.cstep == 0)
        ))) {
      piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return -100;
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      lVar14 = (long)iVar22;
      pMVar8 = (Mat *)(lVar14 * 4);
      uVar25 = 0;
      puVar9 = (undefined4 *)local_88.data;
      local_40 = pMVar8;
      do {
        pMVar5 = pMVar5 + uVar25;
        iVar20 = pMVar5->elempack;
        if (((iVar20 == 4) && (iVar13 == 1)) && (iVar2 = pMVar5->h, 0 < (long)iVar2)) {
          pvVar11 = pMVar5->data;
          iVar3 = pMVar5->w;
          sVar28 = pMVar5->elemsize;
          lVar15 = 0;
          do {
            if (0 < iVar22) {
              puVar18 = (undefined4 *)((long)iVar3 * sVar28 * lVar15 + (long)pvVar11);
              puVar23 = puVar9;
              iVar19 = iVar22;
              do {
                *puVar23 = *puVar18;
                puVar23[lVar14] = puVar18[1];
                puVar23[iVar22 * 2] = puVar18[2];
                puVar23[iVar22 * 3] = puVar18[3];
                puVar23 = puVar23 + 1;
                puVar18 = puVar18 + 4;
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
            puVar9 = puVar9 + (long)pMVar8;
            lVar15 = lVar15 + 1;
          } while (lVar15 != iVar2);
        }
        if (iVar20 == iVar13) {
          lVar15 = pMVar5->h * lVar14;
          memcpy(puVar9,pMVar5->data,pMVar5->elemsize * lVar15);
          local_a0 = (int)lVar15;
          puVar9 = puVar9 + (long)local_a0 * (long)pMVar5->elempack;
          pMVar8 = local_40;
        }
        uVar25 = uVar25 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar25 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (iVar13 < iVar17) {
      convert_packing(&local_88,local_38,iVar17,opt);
    }
    piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
  }
  if ((uVar1 == 2) && (iVar10 == 1)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = pMVar5->h;
    sVar28 = pMVar5->elemsize;
    iVar22 = pMVar5->elempack;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar14 == 0) {
      iVar13 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar6 = &pMVar5->w;
      iVar13 = 0;
      do {
        iVar13 = iVar13 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,iVar13,uVar12,sVar28,iVar22,opt->blob_allocator);
    if (pMVar8->data == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar8->c * pMVar8->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    local_40 = (Mat *)((ulong)local_40 & 0xffffffffffffff00);
    if (0 < (int)uVar12) {
      uVar25 = 0;
      do {
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar5) {
          pvVar11 = (void *)((long)pMVar8->w * uVar25 * pMVar8->elemsize + (long)pMVar8->data);
          lVar14 = 0x2c;
          uVar29 = 0;
          do {
            lVar15 = (long)*(int *)((long)&pMVar5->data + lVar14);
            memcpy(pvVar11,(void *)(uVar25 * lVar15 * *(long *)((long)pMVar5 + lVar14 + -0x1c) +
                                   *(long *)((long)pMVar5 + lVar14 + -0x2c)),lVar15 * sVar28);
            pvVar11 = (void *)((long)pvVar11 +
                              (long)*(int *)((long)&pMVar5->data + lVar14) * (long)iVar22 * 4);
            uVar29 = uVar29 + 1;
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar14 = lVar14 + 0x48;
          } while (uVar29 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar5 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar12);
    }
    if ((char)local_40 != '\0') {
      return -100;
    }
  }
  if ((uVar1 == 3) && (iVar10 == 0)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar22 = pMVar5->w;
    iVar13 = pMVar5->h;
    sVar28 = pMVar5->elemsize;
    iVar17 = pMVar5->elempack;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar14 == 0) {
      uVar12 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      psVar4 = &pMVar5->elemsize;
      uVar12 = 0;
      do {
        if (*psVar4 < sVar28) {
          sVar28 = *psVar4;
        }
        iVar20 = *(int *)(psVar4 + 1);
        if (iVar20 < iVar17) {
          iVar17 = iVar20;
        }
        uVar12 = uVar12 + iVar20 * *(int *)(psVar4 + 5);
        psVar4 = psVar4 + 9;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    bVar7 = (uVar12 & 3) == 0 & opt->use_packing_layout;
    iVar20 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,iVar22,iVar13,(int)uVar12 / iVar20,
                sVar28 / (ulong)(long)iVar17 << bVar7 * '\x02',iVar20,opt->blob_allocator);
    if (pMVar8->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar8->c * pMVar8->cstep == 0) {
      return -100;
    }
    local_88.data = pMVar8->data;
    piVar6 = pMVar8->refcount;
    local_88.refcount._0_4_ = SUB84(piVar6,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)pMVar8->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(pMVar8->elemsize >> 0x20);
    local_88.elempack = pMVar8->elempack;
    local_88.allocator = pMVar8->allocator;
    local_88.dims = pMVar8->dims;
    local_88.w = pMVar8->w;
    local_88.h = pMVar8->h;
    local_88.d = pMVar8->d;
    local_88.c = pMVar8->c;
    local_88.cstep = pMVar8->cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    if ((iVar17 < iVar20) &&
       ((Mat::create(&local_88,iVar22,iVar13,(int)uVar12 / iVar17,sVar28,iVar17,
                     opt->workspace_allocator), local_88.data == (void *)0x0 ||
        ((long)local_88.c * local_88.cstep == 0)))) {
      Mat::~Mat(&local_88);
      return -100;
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      uVar29 = 0;
      uVar25 = 0;
      do {
        pMVar5 = pMVar5 + uVar29;
        if (((pMVar5->elempack == 4) && (iVar17 == 1)) && (iVar22 = pMVar5->c, 0 < (long)iVar22)) {
          iVar13 = pMVar5->h * pMVar5->w;
          uVar25 = (ulong)(int)uVar25;
          lVar15 = local_88.cstep * CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          pvVar16 = (void *)((uVar25 + 3) * lVar15 + (long)local_88.data);
          lVar14 = lVar15 * 4;
          pvVar21 = (void *)((uVar25 + 2) * lVar15 + (long)local_88.data);
          pvVar24 = (void *)((uVar25 + 1) * lVar15 + (long)local_88.data);
          pvVar11 = (void *)(lVar15 * uVar25 + (long)local_88.data);
          lVar15 = 0;
          do {
            if (0 < iVar13) {
              puVar9 = (undefined4 *)
                       (pMVar5->cstep * lVar15 * pMVar5->elemsize + (long)pMVar5->data);
              lVar26 = 0;
              do {
                *(undefined4 *)((long)pvVar11 + lVar26 * 4) = *puVar9;
                *(undefined4 *)((long)pvVar24 + lVar26 * 4) = puVar9[1];
                *(undefined4 *)((long)pvVar21 + lVar26 * 4) = puVar9[2];
                *(undefined4 *)((long)pvVar16 + lVar26 * 4) = puVar9[3];
                puVar9 = puVar9 + 4;
                lVar26 = lVar26 + 1;
              } while (iVar13 != (int)lVar26);
            }
            uVar25 = uVar25 + 4;
            lVar15 = lVar15 + 1;
            pvVar16 = (void *)((long)pvVar16 + lVar14);
            pvVar21 = (void *)((long)pvVar21 + lVar14);
            pvVar24 = (void *)((long)pvVar24 + lVar14);
            pvVar11 = (void *)((long)pvVar11 + lVar14);
          } while (lVar15 != iVar22);
        }
        if (pMVar5->elempack == iVar17) {
          memcpy((void *)(local_88.cstep * (long)(int)uVar25 *
                          CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) +
                         (long)local_88.data),pMVar5->data,
                 (long)((int)pMVar5->cstep * pMVar5->c) * pMVar5->elemsize);
          uVar25 = (ulong)(uint)((int)uVar25 + pMVar5->c);
        }
        uVar29 = uVar29 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar29 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (iVar17 < iVar20) {
      convert_packing(&local_88,pMVar8,iVar20,opt);
    }
    piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
  }
  if ((uVar1 == 3) && (iVar10 == 1)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = pMVar5->c;
    sVar28 = pMVar5->elemsize;
    iVar22 = pMVar5->elempack;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar14 == 0) {
      iVar13 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar6 = &pMVar5->h;
      iVar13 = 0;
      do {
        iVar13 = iVar13 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,pMVar5->w,iVar13,uVar12,sVar28,iVar22,opt->blob_allocator);
    if (pMVar8->data == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar8->c * pMVar8->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    local_40 = pMVar8;
    if (0 < (int)uVar12) {
      uVar25 = 0;
      do {
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar5) {
          pvVar11 = (void *)(local_40->cstep * uVar25 * local_40->elemsize + (long)local_40->data);
          lVar14 = 0x40;
          uVar29 = 0;
          do {
            lVar15 = (long)*(int *)((long)pMVar5 + lVar14 + -0x10) *
                     (long)*(int *)((long)pMVar5 + lVar14 + -0x14);
            memcpy(pvVar11,(void *)(*(long *)((long)&pMVar5->data + lVar14) * uVar25 *
                                    *(long *)((long)pMVar5 + lVar14 + -0x30) +
                                   *(long *)((long)pMVar5 + lVar14 + -0x40)),lVar15 * sVar28);
            pvVar11 = (void *)((long)pvVar11 + (long)((int)lVar15 * iVar22) * 4);
            uVar29 = uVar29 + 1;
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar14 = lVar14 + 0x48;
          } while (uVar29 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar5 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar12);
    }
    if (bVar30) {
      return -100;
    }
  }
  if ((uVar1 == 3) && (iVar10 == 2)) {
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar5->h;
    uVar12 = pMVar5->c;
    sVar28 = pMVar5->elemsize;
    iVar10 = pMVar5->elempack;
    lVar14 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar14 == 0) {
      iVar22 = 0;
    }
    else {
      lVar14 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      piVar6 = &pMVar5->w;
      iVar22 = 0;
      do {
        iVar22 = iVar22 + *piVar6;
        piVar6 = piVar6 + 0x12;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar8,iVar22,uVar1,uVar12,sVar28,iVar10,opt->blob_allocator);
    if (pMVar8->data == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar8->c * pMVar8->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    if (0 < (int)uVar12) {
      uVar25 = 0;
      do {
        if (0 < (int)uVar1) {
          pvVar11 = (void *)(pMVar8->cstep * uVar25 * pMVar8->elemsize + (long)pMVar8->data);
          uVar29 = 0;
          do {
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar5) {
              lVar14 = 0x40;
              uVar27 = 0;
              do {
                lVar15 = *(long *)((long)pMVar5 + lVar14 + -0x30);
                lVar26 = (long)*(int *)((long)pMVar5 + lVar14 + -0x14);
                memcpy(pvVar11,(void *)(lVar15 * uVar29 * lVar26 +
                                       *(long *)((long)&pMVar5->data + lVar14) * uVar25 * lVar15 +
                                       *(long *)((long)pMVar5 + lVar14 + -0x40)),lVar26 * sVar28);
                pvVar11 = (void *)((long)pvVar11 +
                                  (long)*(int *)((long)pMVar5 + lVar14 + -0x14) * (long)iVar10 * 4);
                uVar27 = uVar27 + 1;
                pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar14 = lVar14 + 0x48;
              } while (uVar27 < (ulong)(((long)(bottom_blobs->
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar5 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar1);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar12);
    }
    if (bVar30) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}